

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O0

void TasGrid::IO::readVector<TasGrid::IO::mode_ascii_type,double>
               (istream *is,vector<double,_std::allocator<double>_> *x)

{
  bool bVar1;
  reference pdVar2;
  double *i;
  iterator __end0;
  iterator __begin0;
  vector<double,_std::allocator<double>_> *__range3;
  vector<double,_std::allocator<double>_> *x_local;
  istream *is_local;
  
  __end0 = std::vector<double,_std::allocator<double>_>::begin(x);
  i = (double *)std::vector<double,_std::allocator<double>_>::end(x);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&i);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end0);
    std::istream::operator>>(is,pdVar2);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end0);
  }
  return;
}

Assistant:

void readVector(std::istream &is, std::vector<VecType> &x){
    if (std::is_same<iomode, mode_ascii_type>::value){
        for(auto &i : x) is >> i;
    }else{
        is.read((char*) x.data(), x.size() * sizeof(VecType));
    }
}